

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
* __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>
::_reduce_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
          (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>
          *this,ID_index cellID,initializer_list<std::pair<unsigned_int,_unsigned_int>_> *boundary,
          Dimension dim)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
  *targetColumn;
  _Rb_tree_header *p_Var1;
  Element EVar2;
  uint uVar3;
  undefined4 uVar4;
  size_type sVar5;
  Zp_field_operators<unsigned_int,_void> *pZVar6;
  ID_index IVar7;
  Column_dimension_option CVar8;
  ID_index IVar9;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *pvVar10;
  bool bVar11;
  uint uVar12;
  long lVar13;
  iterator iVar14;
  iterator iVar15;
  pointer ppVar16;
  long lVar17;
  _List_node_base *p_Var18;
  ulong uVar19;
  ulong uVar20;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
  *source;
  long *plVar21;
  pointer ppVar22;
  long *plVar23;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>
  *pCVar24;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar25;
  pair<unsigned_int,_unsigned_int> *idx_h;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  chainsInH;
  Tmp_column column;
  _List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> local_c8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_c0;
  ID_index local_b4;
  pointer local_b0;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>
  *local_a8;
  ID_index local_9c;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_98;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>
  *local_78;
  ulong local_70;
  pointer local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  uVar20 = (ulong)(uint)dim;
  local_9c = cellID;
  std::
  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::map<std::pair<unsigned_int,unsigned_int>const*>
            ((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)&local_60,boundary->_M_array,boundary->_M_array + boundary->_M_len);
  sVar5 = boundary->_M_len;
  local_c0 = __return_storage_ptr__;
  if (dim == -1) {
    if (sVar5 != 0) {
      (__return_storage_ptr__->
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar20 = (ulong)((int)sVar5 - 1);
      goto LAB_001db7cc;
    }
    dim = 0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (sVar5 != 0) {
LAB_001db7cc:
      local_98.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      lVar13 = std::_Rb_tree_decrement(&p_Var1->_M_header);
      lVar17 = *(long *)(this + 0x60);
      local_78 = this + 0x60;
      uVar19 = (ulong)*(uint *)(*(long *)(this + 0x78) + (ulong)*(uint *)(lVar13 + 0x20) * 4);
      local_a8 = this;
      local_70 = uVar20;
      if (*(int *)(lVar17 + 0x18 + uVar19 * 0x40) != -1) {
LAB_001db812:
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
        ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
                        *)this,(Tmp_column *)&local_60,&local_98,(Index)uVar19);
        if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) goto code_r0x001db82f;
        local_c8._M_node._0_4_ = 1;
        local_b4 = cellID;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
        ::_M_emplace_unique<unsigned_int&,int>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                    *)&local_60,&local_b4,(int *)&local_c8);
        local_68 = local_98.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (local_98.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_98.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ppVar16 = local_98.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            plVar21 = (long *)(*(long *)(this + 0x60) + (ulong)ppVar16->first * 0x40 + 0x30);
            plVar23 = (long *)*plVar21;
            local_b0 = ppVar16;
            if (plVar23 != plVar21) {
              EVar2 = ppVar16->second;
              pZVar6 = *(Zp_field_operators<unsigned_int,_void> **)(local_a8 + 0x98);
              do {
                local_c8._M_node._0_4_ = (int)plVar23[2];
                pVar25 = std::
                         _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                         ::_M_emplace_unique<unsigned_int,unsigned_int_const&>
                                   ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                                     *)&local_60,(uint *)&local_c8,(uint *)((long)plVar23 + -4));
                iVar14._M_node = (_Base_ptr)pVar25.first._M_node;
                if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  uVar12 = *(uint *)((long)plVar23 + -4) * EVar2 +
                           *(int *)&iVar14._M_node[1].field_0x4;
                  uVar3 = pZVar6->characteristic_;
                  if (uVar3 <= uVar12) {
                    uVar12 = uVar12 % uVar3;
                  }
                  *(uint *)&iVar14._M_node[1].field_0x4 = uVar12;
                  if (uVar12 == 0) {
                    std::
                    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                                        *)&local_60,iVar14);
                  }
                }
                else {
                  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                            (pZVar6,(Element *)&iVar14._M_node[1].field_0x4,EVar2);
                }
                plVar23 = (long *)*plVar23;
              } while (plVar23 != plVar21);
            }
            ppVar16 = local_b0 + 1;
            this = local_a8;
          } while (ppVar16 != local_68);
        }
        local_c8._M_node._0_4_ = *(undefined4 *)(this + 0x90);
        local_b4 = (ID_index)local_70;
        lVar17 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
        uVar3 = *(uint *)(lVar17 + 0x20);
        std::
        vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>
        ::
        emplace_back<unsigned_int&,std::map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>const&,int&,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>::Column_zp_settings*&>
                  ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>
                    *)local_78,(uint *)&local_c8,
                   (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)&local_60,(int *)&local_b4,
                   (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>_>_>_>_>_>
                    **)(this + 0x58),(Column_zp_settings **)(this + 0x98));
        *(uint *)(*(long *)(this + 0x78) + (ulong)uVar3 * 4) = (uint)local_c8._M_node;
        p_Var18 = (_List_node_base *)operator_new(0x20);
        pCVar24 = this + 0x50;
        uVar4 = *(undefined4 *)(this + 0x50);
        *(int *)&p_Var18[1]._M_next = (int)local_70;
        *(undefined4 *)((long)&p_Var18[1]._M_next + 4) = uVar4;
        *(undefined4 *)&p_Var18[1]._M_prev = 0xffffffff;
        std::__detail::_List_node_base::_M_hook(p_Var18);
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
        local_c8._M_node = *(_List_node_base **)(this + 8);
        std::__detail::
        _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
                  ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)(this + 0x18),(const_iterator)0x0,(uint *)pCVar24,&local_c8);
        goto LAB_001dbd50;
      }
      if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
LAB_001db860:
        do {
          lVar17 = std::_Rb_tree_decrement(&p_Var1->_M_header);
          uVar3 = *(uint *)(*(long *)(this + 0x78) + (ulong)*(uint *)(lVar17 + 0x20) * 4);
          if (*(int *)(*(long *)(this + 0x60) + 0x18 + (ulong)uVar3 * 0x40) == -1) {
            Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
            ::_reduce_by_F((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
                            *)this,(Tmp_column *)&local_60,__return_storage_ptr__,uVar3);
          }
          else {
            Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
            ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
                            *)this,(Tmp_column *)&local_60,&local_98,uVar3);
          }
        } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 0);
        lVar17 = *(long *)local_78;
      }
      ppVar16 = (__return_storage_ptr__->
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = (ulong)ppVar16->first * 0x40;
      Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
      ::operator*=((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
                    *)(lVar17 + lVar13),&ppVar16->second);
      ppVar16 = (local_c0->
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      while (ppVar22 = ppVar16 + 1,
            ppVar22 !=
            (local_c0->
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
        lVar17 = *(long *)local_78;
        targetColumn = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
                        *)(lVar17 + lVar13);
        uVar3 = *(uint *)(lVar17 + 0x14 + lVar13);
        source = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
                  *)((ulong)ppVar22->first * 0x40 + lVar17);
        bVar11 = _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>
                           (&ppVar16[1].second,source,targetColumn);
        if (bVar11) {
          CVar8.dim_ = (targetColumn->super_Column_dimension_option).dim_;
          IVar9 = (targetColumn->super_Chain_column_option).pivot_;
          IVar7 = (source->super_Chain_column_option).pivot_;
          targetColumn->super_Column_dimension_option =
               (Column_dimension_option)(source->super_Column_dimension_option).dim_;
          (targetColumn->super_Chain_column_option).pivot_ = IVar7;
          source->super_Column_dimension_option = (Column_dimension_option)CVar8.dim_;
          (source->super_Chain_column_option).pivot_ = IVar9;
        }
        uVar12 = (targetColumn->super_Chain_column_option).pivot_;
        this = local_a8;
        ppVar16 = ppVar22;
        if (uVar3 != uVar12) {
          lVar17 = *(long *)(local_a8 + 0x78);
          uVar4 = *(undefined4 *)(lVar17 + (ulong)uVar3 * 4);
          *(undefined4 *)(lVar17 + (ulong)uVar3 * 4) = *(undefined4 *)(lVar17 + (ulong)uVar12 * 4);
          *(undefined4 *)(lVar17 + (ulong)uVar12 * 4) = uVar4;
        }
      }
      local_b4 = local_9c;
      local_c8._M_node._0_4_ = 1;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
      ::_M_emplace_unique<unsigned_int&,int>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  *)&local_60,&local_b4,(int *)&local_c8);
      local_68 = local_98.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_98.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_98.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar16 = local_98.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          plVar21 = (long *)(*(long *)(this + 0x60) + (ulong)ppVar16->first * 0x40 + 0x30);
          plVar23 = (long *)*plVar21;
          local_b0 = ppVar16;
          if (plVar23 != plVar21) {
            EVar2 = ppVar16->second;
            pZVar6 = *(Zp_field_operators<unsigned_int,_void> **)(local_a8 + 0x98);
            do {
              local_c8._M_node._0_4_ = (int)plVar23[2];
              pVar25 = std::
                       _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                       ::_M_emplace_unique<unsigned_int,unsigned_int_const&>
                                 ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                                   *)&local_60,(uint *)&local_c8,(uint *)((long)plVar23 + -4));
              iVar14._M_node = (_Base_ptr)pVar25.first._M_node;
              if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                uVar12 = *(uint *)((long)plVar23 + -4) * EVar2 +
                         *(int *)&iVar14._M_node[1].field_0x4;
                uVar3 = pZVar6->characteristic_;
                if (uVar3 <= uVar12) {
                  uVar12 = uVar12 % uVar3;
                }
                *(uint *)&iVar14._M_node[1].field_0x4 = uVar12;
                if (uVar12 == 0) {
                  std::
                  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                                      *)&local_60,iVar14);
                }
              }
              else {
                persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                          (pZVar6,(Element *)&iVar14._M_node[1].field_0x4,EVar2);
              }
              plVar23 = (long *)*plVar23;
            } while (plVar23 != plVar21);
          }
          ppVar16 = local_b0 + 1;
          this = local_a8;
        } while (ppVar16 != local_68);
      }
      uVar3 = ((local_c0->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->first;
      local_b4 = (ID_index)local_70;
      local_c8._M_node._0_4_ = *(undefined4 *)(this + 0x90);
      lVar17 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
      uVar12 = *(uint *)(lVar17 + 0x20);
      std::
      vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>
      ::
      emplace_back<unsigned_int&,std::map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>const&,int&,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>::Column_zp_settings*&>
                ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>
                  *)local_78,(uint *)&local_c8,
                 (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)&local_60,(int *)&local_b4,
                 (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>_>_>_>_>_>
                  **)(this + 0x58),(Column_zp_settings **)(this + 0x98));
      *(uint *)(*(long *)(this + 0x78) + (ulong)uVar12 * 4) = (uint)local_c8._M_node;
      uVar12 = *(uint *)(this + 0x90);
      lVar17 = *(long *)(this + 0x60);
      *(uint *)(lVar17 + 0x18 + (ulong)uVar12 * 0x40) = uVar3;
      *(uint *)(lVar17 + 0x18 + (ulong)uVar3 * 0x40) = uVar12;
      local_c8._M_node._0_4_ = uVar3;
      iVar15 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)(this + 0x18),(key_type *)&local_c8);
      if (iVar15.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      pCVar24 = this + 0x50;
      *(undefined4 *)
       (*(long *)((long)iVar15.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
                        ._M_cur + 0x10) + 0x18) = *(undefined4 *)(this + 0x50);
      std::__detail::
      _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
                ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)(this + 0x18),(const_iterator)0x0,(uint *)pCVar24,
                 (_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
                  *)((long)iVar15.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
                           ._M_cur + 0x10));
      *(uint *)pCVar24 = *(uint *)pCVar24 + 1;
      goto LAB_001dbd5a;
    }
  }
  local_98.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_node._0_4_ = 1;
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::_M_emplace_unique<unsigned_int&,int>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)&local_60,&local_9c,(int *)&local_c8);
  local_c8._M_node._0_4_ = *(undefined4 *)(this + 0x90);
  local_b4 = dim;
  lVar17 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
  uVar3 = *(uint *)(lVar17 + 0x20);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>
  ::
  emplace_back<unsigned_int&,std::map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>const&,int&,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>::Column_zp_settings*&>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>>>
              *)(this + 0x60),(uint *)&local_c8,
             (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)&local_60,(int *)&local_b4,
             (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>_>_>_>_>_>
              **)(this + 0x58),(Column_zp_settings **)(this + 0x98));
  *(uint *)(*(long *)(this + 0x78) + (ulong)uVar3 * 4) = (uint)local_c8._M_node;
  p_Var18 = (_List_node_base *)operator_new(0x20);
  pCVar24 = this + 0x50;
  uVar4 = *(undefined4 *)(this + 0x50);
  *(Dimension *)&p_Var18[1]._M_next = dim;
  *(undefined4 *)((long)&p_Var18[1]._M_next + 4) = uVar4;
  *(undefined4 *)&p_Var18[1]._M_prev = 0xffffffff;
  std::__detail::_List_node_base::_M_hook(p_Var18);
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  local_c8._M_node = *(_List_node_base **)(this + 8);
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(this + 0x18),(const_iterator)0x0,(uint *)pCVar24,&local_c8);
LAB_001dbd50:
  *(uint *)pCVar24 = *(uint *)pCVar24 + 1;
LAB_001dbd5a:
  pvVar10 = local_c0;
  *(int *)(this + 0x90) = *(int *)(this + 0x90) + 1;
  if (local_98.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_60);
  return pvVar10;
code_r0x001db82f:
  lVar17 = std::_Rb_tree_decrement(&p_Var1->_M_header);
  uVar19 = (ulong)*(uint *)(*(long *)(this + 0x78) + (ulong)*(uint *)(lVar17 + 0x20) * 4);
  if (*(int *)(*(long *)(this + 0x60) + 0x18 + uVar19 * 0x40) == -1) goto LAB_001db860;
  goto LAB_001db812;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}